

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

bool __thiscall HEkk::isUnconstrainedLp(HEkk *this)

{
  uint uVar1;
  
  uVar1 = (this->lp_).num_row_;
  if ((int)uVar1 < 1) {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                "HEkkDual::solve called for LP with non-positive (%d) number of constraints\n",
                (ulong)uVar1);
  }
  return (int)uVar1 < 1;
}

Assistant:

bool HEkk::isUnconstrainedLp() {
  bool is_unconstrained_lp = lp_.num_row_ <= 0;
  if (is_unconstrained_lp)
    highsLogDev(
        options_->log_options, HighsLogType::kError,
        "HEkkDual::solve called for LP with non-positive (%" HIGHSINT_FORMAT
        ") number of constraints\n",
        lp_.num_row_);
  assert(!is_unconstrained_lp);
  return is_unconstrained_lp;
}